

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void absl::lts_20240722::container_internal::ClearBackingArray
               (CommonFields *c,PolicyFunctions *policy,bool reuse,bool soo_enabled)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  size_t sVar4;
  CommonFields local_40;
  HashtablezInfoHandle local_1f [2];
  HashtablezInfoHandle local_1d [2];
  HashtablezInfoHandle local_1b;
  byte local_1a;
  byte local_19;
  bool soo_enabled_local;
  PolicyFunctions *pPStack_18;
  bool reuse_local;
  PolicyFunctions *policy_local;
  CommonFields *c_local;
  
  local_1a = soo_enabled;
  local_19 = reuse;
  pPStack_18 = policy;
  policy_local = (PolicyFunctions *)c;
  CommonFields::set_size(c,0);
  if ((local_19 & 1) == 0) {
    CommonFields::infoz((CommonFields *)policy_local);
    HashtablezInfoHandle::RecordClearedReservation(local_1d);
    CommonFields::infoz((CommonFields *)policy_local);
    bVar2 = local_1a;
    sVar4 = SooCapacity();
    sVar3 = 0;
    if ((bVar2 & 1) != 0) {
      sVar3 = sVar4;
    }
    HashtablezInfoHandle::RecordStorageChanged(local_1f,0,sVar3);
    (*pPStack_18->dealloc)((CommonFields *)policy_local,pPStack_18);
    if ((local_1a & 1) == 0) {
      CommonFields::CommonFields(&local_40);
    }
    else {
      CommonFields::CommonFields(&local_40);
    }
    policy_local->slot_size = local_40.capacity_;
    policy_local->hash_fn = (_func_void_ptr_CommonFields_ptr *)local_40.size_;
    policy_local->hash_slot = (_func_size_t_void_ptr_void_ptr *)local_40.heap_or_soo_.heap.control;
    policy_local->transfer =
         (_func_void_void_ptr_void_ptr_void_ptr *)local_40.heap_or_soo_.heap.slot_array;
  }
  else {
    bVar1 = true;
    if ((local_1a & 1) != 0) {
      sVar3 = CommonFields::capacity((CommonFields *)policy_local);
      sVar4 = SooCapacity();
      bVar1 = sVar4 < sVar3;
    }
    if (!bVar1) {
      __assert_fail("!soo_enabled || c.capacity() > SooCapacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0x14b,
                    "void absl::container_internal::ClearBackingArray(CommonFields &, const PolicyFunctions &, bool, bool)"
                   );
    }
    ResetCtrl((CommonFields *)policy_local,pPStack_18->slot_size);
    ResetGrowthLeft((CommonFields *)policy_local);
    CommonFields::infoz((CommonFields *)policy_local);
    sVar3 = CommonFields::capacity((CommonFields *)policy_local);
    HashtablezInfoHandle::RecordStorageChanged(&local_1b,0,sVar3);
  }
  return;
}

Assistant:

void ClearBackingArray(CommonFields& c, const PolicyFunctions& policy,
                       bool reuse, bool soo_enabled) {
  c.set_size(0);
  if (reuse) {
    assert(!soo_enabled || c.capacity() > SooCapacity());
    ResetCtrl(c, policy.slot_size);
    ResetGrowthLeft(c);
    c.infoz().RecordStorageChanged(0, c.capacity());
  } else {
    // We need to record infoz before calling dealloc, which will unregister
    // infoz.
    c.infoz().RecordClearedReservation();
    c.infoz().RecordStorageChanged(0, soo_enabled ? SooCapacity() : 0);
    (*policy.dealloc)(c, policy);
    c = soo_enabled ? CommonFields{soo_tag_t{}} : CommonFields{};
  }
}